

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O3

void trimesh::get_contrib_cps<(trimesh::eGDIR)0,1>(mscomplex_ptr_t *msc,contrib_t *contrib)

{
  element_type *peVar1;
  pointer pmVar2;
  iterator iVar3;
  mscomplex_t *pmVar4;
  int *piVar5;
  pointer piVar6;
  undefined8 uVar7;
  type tVar8;
  undefined8 uVar9;
  shared_count sVar10;
  undefined8 uVar11;
  type tVar12;
  undefined8 uVar13;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  reference rVar19;
  vector<int,std::allocator<int>> *pvVar20;
  char *pcVar21;
  char *pcVar22;
  mapped_type *pmVar23;
  _Base_ptr p_Var24;
  pair<int,_int> pVar25;
  ostream *poVar26;
  runtime_error *prVar27;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int *piVar28;
  pointer piVar29;
  _Base_ptr p_Var30;
  int qa;
  value_type pr;
  int qaqa;
  stringstream ss;
  int p_;
  int p;
  contrib_t contrib_map;
  iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>
  local_640;
  undefined1 local_638 [16];
  undefined1 auStack_628 [16];
  shared_count local_618;
  shared_count local_610;
  undefined1 local_608 [16];
  undefined1 local_5f8 [24];
  undefined1 local_5e0 [24];
  undefined1 local_5c8 [32];
  shared_count local_5a8;
  type local_5a0;
  type local_598;
  undefined1 auStack_590 [24];
  shared_count local_578;
  type local_570;
  ulong uStack_568;
  undefined1 local_560 [32];
  type local_540;
  bool local_538;
  undefined1 local_530 [32];
  type local_510;
  int local_4fc;
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [24];
  shared_count local_4d0;
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  undefined1 local_4a0 [16];
  shared_count local_490;
  undefined1 local_488 [32];
  counting_iterator<int,_boost::use_default,_boost::use_default> local_468;
  undefined1 local_460 [16];
  undefined1 local_450 [24];
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_438;
  undefined1 local_430 [16];
  shared_count local_420;
  shared_count sStack_418;
  ulong local_410;
  undefined1 local_408 [24];
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_3f0;
  ulong uStack_3e8;
  undefined1 local_3e0 [16];
  shared_count local_3d0;
  counting_iterator<int,_boost::use_default,_boost::use_default> local_3c8;
  undefined1 local_3c0 [24];
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_3a8;
  shared_count local_3a0;
  undefined1 local_398 [24];
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Stack_380;
  ulong local_378;
  shared_count local_370;
  counting_iterator<int,_boost::use_default,_boost::use_default> local_368;
  char local_360;
  type local_358;
  ulong uStack_350;
  type local_348;
  shared_count local_340;
  type local_338;
  reference local_2d8;
  contrib_t *local_2d0;
  undefined1 local_2c8 [16];
  shared_count local_2b8;
  shared_count sStack_2b0;
  shared_count local_2a8;
  shared_count local_2a0;
  type local_298;
  type tStack_290;
  shared_count local_288;
  pair<int,_int> *ppStack_280;
  ulong local_278;
  shared_count local_270;
  ulong uStack_268;
  shared_count local_260;
  type local_258;
  ulong uStack_250;
  type local_248;
  shared_count local_240;
  int local_238;
  undefined1 local_230 [16];
  element_type *local_220;
  shared_count local_218;
  element_type *local_210;
  shared_count local_208;
  element_type *local_200;
  shared_count local_1f8;
  element_type *local_1f0;
  shared_count local_1e8;
  element_type *local_1e0;
  shared_count local_1d8;
  undefined1 local_1d0 [16];
  type local_1c0;
  shared_count local_1b8;
  bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_1b0;
  bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_198;
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_180;
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_160;
  undefined1 local_140 [40];
  bool local_118;
  shared_count local_100 [2];
  bool local_f0;
  shared_count local_d8 [2];
  bool local_c8;
  shared_count local_b0;
  bool local_a8;
  shared_count local_90 [2];
  bool local_80;
  shared_count local_68;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  peVar1 = msc->px;
  local_2d0 = contrib;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (peVar1 != (element_type *)0x0) {
    local_230._0_8_ =
         (peVar1->m_canc_list).
         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_230._8_8_ = local_230._0_8_ + (long)peVar1->m_multires_version * 8;
    local_1d8.pi_ = (msc->pn).pi_;
    if (local_1d8.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1d8.pi_)->use_count_ = (local_1d8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    local_1e0 = peVar1;
    boost::
    bind<std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
              (&local_198,(boost *)order_by_dir_index<(trimesh::eGDIR)0>,&local_1e0);
    boost::range_detail::forwarder<boost::range_detail::transform_holder>::operator()
              ((transform_holder<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                *)local_4f8,
               (forwarder<boost::range_detail::transform_holder> *)
               &boost::adaptors::(anonymous_namespace)::transformed,&local_198);
    local_638._8_8_ = local_4f8._0_8_;
    auStack_628._8_8_ = local_4e8._0_8_;
    if ((type)local_4e8._0_8_ != (type)0x0) {
      LOCK();
      *(uint_least32_t *)(local_4e8._0_8_ + 8) = *(uint_least32_t *)(local_4e8._0_8_ + 8) + 1;
      UNLOCK();
    }
    local_638[0] = true;
    boost::range_detail::
    transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
    ::transformed_range((transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                         *)local_460,(transform_fn_type *)local_638,
                        (sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                         *)local_230);
    if ((bool)local_638[0] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(auStack_628 + 8));
    }
    local_1f0 = msc->px;
    local_1e8.pi_ = (msc->pn).pi_;
    if (local_1e8.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (local_1e8.pi_)->use_count_ = (local_1e8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    boost::
    bind<bool,boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
              (&local_1b0,(boost *)is_dim_pair<1,0>,&local_1f0);
    boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
              ((filter_holder<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                *)local_2c8,
               (forwarder<boost::range_detail::filter_holder> *)
               &boost::adaptors::(anonymous_namespace)::filtered,&local_1b0);
    local_638._0_8_ = local_2c8._0_8_;
    local_638._8_8_ = local_2c8._8_8_;
    auStack_628._0_8_ = local_2b8.pi_;
    if ((type)local_2b8.pi_ != (type)0x0) {
      LOCK();
      (local_2b8.pi_)->use_count_ = (local_2b8.pi_)->use_count_ + 1;
      UNLOCK();
    }
    boost::range_detail::
    filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
    ::filtered_range((filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)local_140,
                     (bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
                      *)local_638,
                     (transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      *)local_460);
    boost::detail::shared_count::~shared_count((shared_count *)auStack_628);
    boost::detail::shared_count::~shared_count(&local_2b8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&local_1b0.l_.
                       super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                       .super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>
                       .a1_.t_ + 8));
    boost::detail::shared_count::~shared_count(&local_1e8);
    if ((bool)local_430[0] == true) {
      boost::detail::shared_count::~shared_count(&sStack_418);
      local_430._0_8_ = local_430._0_8_ & 0xffffffffffffff00;
    }
    if ((bool)local_460[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_450 + 0x10));
      local_460[8] = false;
    }
    boost::detail::shared_count::~shared_count((shared_count *)local_4e8);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               ((long)&local_198.l_.
                       super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                       .super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>
                       .a1_.t_ + 8));
    boost::detail::shared_count::~shared_count(&local_1d8);
    boost::range_detail::
    reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
    ::reversed_range((reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
                      *)local_460,
                     (filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)local_140);
    tVar12.m_iterator.super_type.m_iterator = local_5a0.m_iterator.super_type.m_iterator;
    uVar11 = local_5c8._8_8_;
    uVar9 = local_5f8._16_8_;
    sVar10.pi_ = local_610.pi_;
    uVar7 = local_638._8_8_;
    local_638._0_8_ = local_460._0_8_;
    local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
    if ((bool)local_460[8] == true) {
      auStack_628._0_8_ = local_450._0_8_;
      auStack_628._8_8_ = local_450._8_8_;
      local_618.pi_ = (sp_counted_base *)local_450._16_8_;
      if (local_450._16_8_ != 0) {
        LOCK();
        *(int *)(local_450._16_8_ + 8) = *(int *)(local_450._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_638._9_7_ = SUB87(uVar7,1);
      local_638[8] = 1;
    }
    local_610.pi_ = local_610.pi_ & 0xffffffffffffff00;
    if ((bool)local_438._M_current._0_1_ == true) {
      local_608._0_8_ = local_430._0_8_;
      local_608._8_8_ = local_430._8_8_;
      local_5f8._0_8_ = local_420.pi_;
      if (local_420.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)((long)local_420.pi_ + 8) =
             *(uint_least32_t *)((long)local_420.pi_ + 8) + 1;
        UNLOCK();
      }
      local_610.pi_._1_7_ = SUB87(sVar10.pi_,1);
      local_610.pi_._0_1_ = 1;
    }
    local_5f8._8_8_ = sStack_418.pi_;
    local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
    if (local_410._0_1_ == true) {
      local_5e0._0_8_ = local_408._0_8_;
      local_5e0._8_8_ = local_408._8_8_;
      local_5e0._16_8_ = local_408._16_8_;
      if ((sp_counted_base *)local_408._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_408._16_8_ + 8) = *(uint_least32_t *)(local_408._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_5f8._17_7_ = SUB87(uVar9,1);
      local_5f8[0x10] = 1;
    }
    local_5c8._0_8_ = local_3f0._M_current;
    local_5c8._8_8_ = local_5c8._8_8_ & 0xffffffffffffff00;
    if (uStack_3e8._0_1_ == true) {
      local_5c8._16_8_ = local_3e0._0_8_;
      local_5c8._24_8_ = local_3e0._8_8_;
      local_5a8.pi_ = (sp_counted_base *)CONCAT44(local_3d0.pi_._4_4_,local_3d0.pi_._0_4_);
      if (local_5a8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_5a8.pi_)->use_count_ = (local_5a8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_5c8._9_7_ = SUB87(uVar11,1);
      local_5c8[8] = 1;
    }
    local_5a0.m_iterator.super_type.m_iterator =
         (counting_iterator<int,_boost::use_default,_boost::use_default>)
         ((uint)local_5a0.m_iterator.super_type.m_iterator & 0xffffff00);
    if (local_3c8.super_type.m_iterator._0_1_ == true) {
      local_598._1_7_ = local_3c0._1_7_;
      local_598._0_1_ = local_3c0[0];
      auStack_590._0_8_ = local_3c0._8_8_;
      auStack_590._8_8_ = local_3c0._16_8_;
      if ((sp_counted_base *)local_3c0._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_3c0._16_8_ + 8) = *(uint_least32_t *)(local_3c0._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_5a0.m_iterator.super_type.m_iterator._1_3_ =
           tVar12.m_iterator.super_type.m_iterator._1_3_;
      local_5a0.m_iterator.super_type.m_iterator._0_1_ = 1;
    }
    auStack_590._16_8_ = local_3a8._M_current;
    local_578.pi_._0_1_ = '\0';
    if (local_3a0.pi_._0_1_ == true) {
      local_570._4_4_ = local_398._4_4_;
      local_570._0_4_ = local_398._0_4_;
      uStack_568 = CONCAT71(local_398._9_7_,local_398[8]);
      local_560._0_8_ = local_398._16_8_;
      if ((sp_counted_base *)local_398._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_398._16_8_ + 8) = *(uint_least32_t *)(local_398._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_578.pi_._0_1_ = '\x01';
    }
    if (((ulong)local_3a0.pi_ & 1) != 0) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_398 + 0x10));
      local_3a0.pi_ = local_3a0.pi_ & 0xffffffffffffff00;
    }
    if (local_3c8.super_type.m_iterator._0_1_ == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_3c0 + 0x10));
      local_3c8.super_type.m_iterator = (type)((uint)local_3c8.super_type.m_iterator & 0xffffff00);
    }
    if (uStack_3e8._0_1_ == true) {
      boost::detail::shared_count::~shared_count(&local_3d0);
      uStack_3e8 = uStack_3e8 & 0xffffffffffffff00;
    }
    if (local_410._0_1_ == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_408 + 0x10));
      local_410 = local_410 & 0xffffffffffffff00;
    }
    if ((bool)local_438._M_current._0_1_ == true) {
      boost::detail::shared_count::~shared_count(&local_420);
      local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    }
    if ((bool)local_460[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_450 + 0x10));
    }
    uVar15 = local_410;
    _Var14._M_current = local_438._M_current;
    uVar7 = _local_4a8;
    sVar10.pi_ = local_4d0.pi_;
    local_460._0_8_ = local_638._0_8_;
    local_460[8] = false;
    if (local_638[8] == '\x01') {
      local_450._0_8_ = auStack_628._0_8_;
      local_450._8_8_ = auStack_628._8_8_;
      local_450._16_8_ = local_618.pi_;
      if (local_618.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        ((pair<int,_int> *)((long)local_618.pi_ + 8))->first =
             ((pair<int,_int> *)((long)local_618.pi_ + 8))->first + 1;
        UNLOCK();
      }
      local_460[8] = true;
    }
    local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    if ((bool)local_610.pi_._0_1_ == true) {
      local_430._0_8_ = local_608._0_8_;
      local_430._8_8_ = local_608._8_8_;
      local_420.pi_ = (sp_counted_base *)local_5f8._0_8_;
      if ((type)local_5f8._0_8_ != (type)0x0) {
        LOCK();
        *(uint_least32_t *)(local_5f8._0_8_ + 8) = *(uint_least32_t *)(local_5f8._0_8_ + 8) + 1;
        UNLOCK();
      }
      local_438._M_current._1_7_ = SUB87(_Var14._M_current,1);
      local_438._M_current._0_1_ = 1;
    }
    sStack_418.pi_ = (sp_counted_base *)local_5f8._8_8_;
    local_410 = local_410 & 0xffffffffffffff00;
    if ((bool)local_5f8[0x10] == true) {
      local_408._0_8_ = local_5e0._0_8_;
      local_408._8_8_ = local_5e0._8_8_;
      local_408._16_8_ = local_5e0._16_8_;
      if ((sp_counted_base *)local_5e0._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_5e0._16_8_ + 8) = *(uint_least32_t *)(local_5e0._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_410._1_7_ = SUB87(uVar15,1);
      local_410 = CONCAT71(local_410._1_7_,1);
    }
    local_4f8._0_8_ = local_638._0_8_;
    local_4f8[8] = false;
    if ((bool)local_460[8] == true) {
      local_4e8._0_8_ = local_450._0_8_;
      local_4e8._8_8_ = local_450._8_8_;
      local_4e8._16_8_ = local_450._16_8_;
      if (local_450._16_8_ != 0) {
        LOCK();
        *(int *)(local_450._16_8_ + 8) = *(int *)(local_450._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_4f8[8] = true;
    }
    local_4d0.pi_ = local_4d0.pi_ & 0xffffffffffffff00;
    if ((bool)local_438._M_current._0_1_ == true) {
      local_4c8._0_8_ = local_430._0_8_;
      local_4c8._8_8_ = local_430._8_8_;
      local_4b8._0_8_ = local_420.pi_;
      if (local_420.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)((long)local_420.pi_ + 8) =
             *(uint_least32_t *)((long)local_420.pi_ + 8) + 1;
        UNLOCK();
      }
      local_4d0.pi_._1_7_ = SUB87(sVar10.pi_,1);
      local_4d0.pi_._0_1_ = 1;
    }
    local_4b8._8_8_ = local_5f8._8_8_;
    _local_4a8 = _local_4a8 & 0xffffffffffffff00;
    if (local_410._0_1_ == true) {
      local_4a0._0_8_ = local_408._0_8_;
      local_4a0._8_8_ = local_408._8_8_;
      local_490.pi_ = (sp_counted_base *)local_408._16_8_;
      if ((sp_counted_base *)local_408._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_408._16_8_ + 8) = *(uint_least32_t *)(local_408._16_8_ + 8) + 1;
        UNLOCK();
      }
      uStack_4a7 = SUB87(uVar7,1);
      local_4a8 = 1;
    }
    if (local_410._0_1_ != false) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_408 + 0x10));
      local_410 = local_410 & 0xffffffffffffff00;
    }
    if ((bool)local_438._M_current._0_1_ == true) {
      boost::detail::shared_count::~shared_count(&local_420);
      local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    }
    if ((bool)local_460[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_450 + 0x10));
    }
    uVar16 = local_278;
    sVar10.pi_ = local_2a0.pi_;
    uVar7 = local_2c8._8_8_;
    uVar15 = local_410;
    _Var14._M_current = local_438._M_current;
    local_460._0_8_ = local_5c8._0_8_;
    local_460[8] = false;
    if (local_5c8[8] == '\x01') {
      local_450._0_8_ = local_5c8._16_8_;
      local_450._8_8_ = local_5c8._24_8_;
      local_450._16_8_ = local_5a8.pi_;
      if (local_5a8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_5a8.pi_)->use_count_ = (local_5a8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      local_460[8] = true;
    }
    local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    if ((char)local_5a0.m_iterator.super_type.m_iterator == '\x01') {
      local_430._0_8_ = local_598;
      local_430._8_8_ = auStack_590._0_8_;
      local_420.pi_ = (sp_counted_base *)auStack_590._8_8_;
      if ((sp_counted_base *)auStack_590._8_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(auStack_590._8_8_ + 8) = *(uint_least32_t *)(auStack_590._8_8_ + 8) + 1;
        UNLOCK();
      }
      local_438._M_current._1_7_ = SUB87(_Var14._M_current,1);
      local_438._M_current._0_1_ = 1;
    }
    sStack_418.pi_ = (sp_counted_base *)auStack_590._16_8_;
    local_410 = local_410 & 0xffffffffffffff00;
    if (local_578.pi_._0_1_ == '\x01') {
      local_408._0_8_ = local_570;
      local_408._8_8_ = uStack_568;
      local_408._16_8_ = local_560._0_8_;
      if ((type)local_560._0_8_ != (type)0x0) {
        LOCK();
        *(uint_least32_t *)(local_560._0_8_ + 8) = *(uint_least32_t *)(local_560._0_8_ + 8) + 1;
        UNLOCK();
      }
      local_410._1_7_ = SUB87(uVar15,1);
      local_410 = CONCAT71(local_410._1_7_,1);
    }
    local_2c8._0_8_ = local_5c8._0_8_;
    local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
    if ((bool)local_460[8] == true) {
      local_2b8.pi_ = (sp_counted_base *)local_450._0_8_;
      sStack_2b0.pi_ = (sp_counted_base *)local_450._8_8_;
      local_2a8.pi_ = (sp_counted_base *)local_450._16_8_;
      if (local_450._16_8_ != 0) {
        LOCK();
        *(int *)(local_450._16_8_ + 8) = *(int *)(local_450._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_2c8._9_7_ = SUB87(uVar7,1);
      local_2c8[8] = 1;
    }
    local_2a0.pi_ = local_2a0.pi_ & 0xffffffffffffff00;
    if ((bool)local_438._M_current._0_1_ == true) {
      local_298 = (type)local_430._0_8_;
      tStack_290 = (type)local_430._8_8_;
      local_288.pi_ = local_420.pi_;
      if (local_420.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)((long)local_420.pi_ + 8) =
             *(uint_least32_t *)((long)local_420.pi_ + 8) + 1;
        UNLOCK();
      }
      local_2a0.pi_._1_7_ = SUB87(sVar10.pi_,1);
      local_2a0.pi_._0_1_ = 1;
    }
    ppStack_280 = (pair<int,_int> *)auStack_590._16_8_;
    local_278 = local_278 & 0xffffffffffffff00;
    if (local_410._0_1_ == true) {
      local_270.pi_ = (sp_counted_base *)local_408._0_8_;
      uStack_268 = local_408._8_8_;
      local_260.pi_ = (sp_counted_base *)local_408._16_8_;
      if ((sp_counted_base *)local_408._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_408._16_8_ + 8) = *(uint_least32_t *)(local_408._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_278 = CONCAT71(SUB87(uVar16,1),1);
    }
    if (local_410._0_1_ != false) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_408 + 0x10));
      local_410 = local_410 & 0xffffffffffffff00;
    }
    if ((bool)local_438._M_current._0_1_ == true) {
      boost::detail::shared_count::~shared_count(&local_420);
      local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    }
    if ((bool)local_460[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_450 + 0x10));
    }
    while (local_4f8._0_8_ != local_2c8._0_8_) {
      rVar19 = boost::iterators::
               reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
               ::dereference((reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                              *)local_4f8);
      local_1d0._0_4_ = rVar19.first;
      pvVar20 = (vector<int,std::allocator<int>> *)
                std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                              *)&local_60,(key_type *)local_1d0);
      if (msc->px == (element_type *)0x0) goto LAB_0016f690;
      pmVar2 = msc->px->m_conn[1].
               super__Vector_base<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var30 = (_Base_ptr)((long)&pmVar2[(long)rVar19 >> 0x20]._M_t._M_impl + 8);
      p_Var24 = *(_Base_ptr *)((long)&pmVar2[(long)rVar19 >> 0x20]._M_t._M_impl + 0x18);
      local_2d8 = rVar19;
      if (p_Var24 != p_Var30) {
        local_2d8 = (reference)((ulong)rVar19 >> 0x20);
        do {
          local_640.
          super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin.super_type.m_iterator = (type)p_Var24[1]._M_color;
          if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
          bVar17 = mscomplex_t::is_not_paired
                             (msc->px,(int)local_640.
                                           super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                                           .
                                           super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                                           .
                                           super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                                           .m_Begin.super_type.m_iterator);
          if (bVar17) {
            iVar3._M_current = *(int **)(pvVar20 + 8);
            if (iVar3._M_current == *(int **)(pvVar20 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar20,iVar3,(int *)&local_640);
            }
            else {
              *iVar3._M_current =
                   (int)local_640.
                        super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                        .
                        super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                        .
                        super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                        .m_Begin.super_type.m_iterator;
              *(int **)(pvVar20 + 8) = iVar3._M_current + 1;
            }
          }
          else {
            if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
            pcVar21 = mscomplex_t::index(msc->px,(char *)local_2d8,__c);
            pmVar4 = msc->px;
            if (pmVar4 == (mscomplex_t *)0x0) goto LAB_0016f690;
            uVar18 = mscomplex_t::pair_idx
                               (pmVar4,(int)local_640.
                                            super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
                                            .
                                            super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
                                            .
                                            super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
                                            .m_Begin.super_type.m_iterator);
            pcVar22 = mscomplex_t::index(pmVar4,(char *)(ulong)uVar18,__c_00);
            if ((int)pcVar21 == (int)pcVar22) {
              pmVar23 = std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)&local_60,(key_type *)&local_640);
              piVar5 = (pmVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              for (piVar28 = (pmVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start; piVar28 != piVar5;
                  piVar28 = piVar28 + 1) {
                local_4fc = *piVar28;
                iVar3._M_current = *(int **)(pvVar20 + 8);
                if (iVar3._M_current == *(int **)(pvVar20 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar20,iVar3,&local_4fc);
                }
                else {
                  *iVar3._M_current = local_4fc;
                  *(int **)(pvVar20 + 8) = iVar3._M_current + 1;
                }
                if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
                bVar17 = mscomplex_t::is_not_paired(msc->px,local_4fc);
                if (!bVar17) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_460);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_450,"Failed to assert condition ",0x1b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_450,"msc->is_not_paired(qaqa)",0x18);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"at (",4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_450,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                             ,0x69);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_450,"get_contrib_cps",0xf);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
                  poVar26 = (ostream *)std::ostream::operator<<((ostream *)local_450,0x28e);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar26,") \n ",4);
                  prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::__cxx11::stringbuf::str();
                  std::runtime_error::runtime_error(prVar27,(string *)local_230);
                  __cxa_throw(prVar27,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
              }
            }
          }
          p_Var24 = (_Base_ptr)std::_Rb_tree_increment(p_Var24);
        } while (p_Var24 != p_Var30);
      }
      boost::iterators::
      filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
      ::decrement((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                   *)local_4f8);
    }
    if ((char)local_278 == '\x01') {
      boost::detail::shared_count::~shared_count(&local_260);
      local_278 = local_278 & 0xffffffffffffff00;
    }
    if ((char)local_2a0.pi_ == '\x01') {
      boost::detail::shared_count::~shared_count(&local_288);
      local_2a0.pi_ = local_2a0.pi_ & 0xffffffffffffff00;
    }
    if (local_2c8[8] == '\x01') {
      boost::detail::shared_count::~shared_count(&local_2a8);
    }
    if ((bool)local_4a8 == true) {
      boost::detail::shared_count::~shared_count(&local_490);
      _local_4a8 = _local_4a8 & 0xffffffffffffff00;
    }
    if ((bool)local_4d0.pi_._0_1_ == true) {
      boost::detail::shared_count::~shared_count((shared_count *)local_4b8);
      local_4d0.pi_ = local_4d0.pi_ & 0xffffffffffffff00;
    }
    if ((bool)local_4f8[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 0x10));
    }
    if (local_578.pi_._0_1_ == '\x01') {
      boost::detail::shared_count::~shared_count((shared_count *)local_560);
      local_578.pi_._0_1_ = '\0';
    }
    if ((char)local_5a0.m_iterator.super_type.m_iterator == '\x01') {
      boost::detail::shared_count::~shared_count((shared_count *)(auStack_590 + 8));
      local_5a0.m_iterator.super_type.m_iterator =
           (counting_iterator<int,_boost::use_default,_boost::use_default>)
           ((uint)local_5a0.m_iterator.super_type.m_iterator & 0xffffff00);
    }
    if (local_5c8[8] == '\x01') {
      boost::detail::shared_count::~shared_count(&local_5a8);
      local_5c8._8_8_ = local_5c8._8_8_ & 0xffffffffffffff00;
    }
    if ((bool)local_5f8[0x10] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_5e0 + 0x10));
      local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
    }
    if ((bool)local_610.pi_._0_1_ == true) {
      boost::detail::shared_count::~shared_count((shared_count *)local_5f8);
      local_610.pi_ = local_610.pi_ & 0xffffffffffffff00;
    }
    if (local_638[8] == '\x01') {
      boost::detail::shared_count::~shared_count(&local_618);
    }
    boost::iterator_range_detail::
    iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
    ::begin((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
             *)local_140);
    uVar9 = local_5f8._16_8_;
    sVar10.pi_ = local_610.pi_;
    uVar7 = local_638._8_8_;
    local_638._0_8_ = local_460._0_8_;
    local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
    if ((bool)local_460[8] == true) {
      auStack_628._0_8_ = local_450._0_8_;
      auStack_628._8_8_ = local_450._8_8_;
      local_618.pi_ = (sp_counted_base *)local_450._16_8_;
      if (local_450._16_8_ != 0) {
        LOCK();
        *(int *)(local_450._16_8_ + 8) = *(int *)(local_450._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_638._9_7_ = SUB87(uVar7,1);
      local_638[8] = 1;
    }
    local_610.pi_ = local_610.pi_ & 0xffffffffffffff00;
    if ((bool)local_438._M_current._0_1_ == true) {
      local_608._0_8_ = local_430._0_8_;
      local_608._8_8_ = local_430._8_8_;
      local_5f8._0_8_ = local_420.pi_;
      if (local_420.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)((long)local_420.pi_ + 8) =
             *(uint_least32_t *)((long)local_420.pi_ + 8) + 1;
        UNLOCK();
      }
      local_610.pi_._1_7_ = SUB87(sVar10.pi_,1);
      local_610.pi_._0_1_ = 1;
    }
    local_5f8._8_8_ = sStack_418.pi_;
    local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
    if (local_410._0_1_ == true) {
      local_5e0._0_8_ = local_408._0_8_;
      local_5e0._8_8_ = local_408._8_8_;
      local_5e0._16_8_ = local_408._16_8_;
      if ((sp_counted_base *)local_408._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_408._16_8_ + 8) = *(uint_least32_t *)(local_408._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_5f8._17_7_ = SUB87(uVar9,1);
      local_5f8[0x10] = 1;
    }
    if ((local_410 & 1) != 0) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_408 + 0x10));
      local_410 = local_410 & 0xffffffffffffff00;
    }
    if ((bool)local_438._M_current._0_1_ == true) {
      boost::detail::shared_count::~shared_count(&local_420);
      local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    }
    if ((bool)local_460[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_450 + 0x10));
    }
    boost::iterator_range_detail::
    iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
    ::end((iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
           *)local_140);
    uVar7 = _local_4a8;
    sVar10.pi_ = local_4d0.pi_;
    local_4f8._0_8_ = local_460._0_8_;
    local_4f8[8] = false;
    if ((bool)local_460[8] == true) {
      local_4e8._0_8_ = local_450._0_8_;
      local_4e8._8_8_ = local_450._8_8_;
      local_4e8._16_8_ = local_450._16_8_;
      if (local_450._16_8_ != 0) {
        LOCK();
        *(int *)(local_450._16_8_ + 8) = *(int *)(local_450._16_8_ + 8) + 1;
        UNLOCK();
      }
      local_4f8[8] = true;
    }
    local_4d0.pi_ = local_4d0.pi_ & 0xffffffffffffff00;
    if ((bool)local_438._M_current._0_1_ == true) {
      local_4c8._0_8_ = local_430._0_8_;
      local_4c8._8_8_ = local_430._8_8_;
      local_4b8._0_8_ = local_420.pi_;
      if (local_420.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)((long)local_420.pi_ + 8) =
             *(uint_least32_t *)((long)local_420.pi_ + 8) + 1;
        UNLOCK();
      }
      local_4d0.pi_._1_7_ = SUB87(sVar10.pi_,1);
      local_4d0.pi_._0_1_ = 1;
    }
    local_4b8._8_8_ = sStack_418.pi_;
    _local_4a8 = _local_4a8 & 0xffffffffffffff00;
    if (local_410._0_1_ == true) {
      local_4a0._0_8_ = local_408._0_8_;
      local_4a0._8_8_ = local_408._8_8_;
      local_490.pi_ = (sp_counted_base *)local_408._16_8_;
      if ((sp_counted_base *)local_408._16_8_ != (sp_counted_base *)0x0) {
        LOCK();
        *(uint_least32_t *)(local_408._16_8_ + 8) = *(uint_least32_t *)(local_408._16_8_ + 8) + 1;
        UNLOCK();
      }
      uStack_4a7 = SUB87(uVar7,1);
      local_4a8 = 1;
    }
    if ((local_410 & 1) != 0) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_408 + 0x10));
      local_410 = local_410 & 0xffffffffffffff00;
    }
    if ((bool)local_438._M_current._0_1_ == true) {
      boost::detail::shared_count::~shared_count(&local_420);
      local_438._M_current = local_438._M_current & 0xffffffffffffff00;
    }
    if ((bool)local_460[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_450 + 0x10));
    }
    if (local_638._0_8_ != local_4f8._0_8_) {
      do {
        pVar25 = boost::range_detail::
                 default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::pair<int,int>>
                 ::operator()((default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,std::pair<int,int>>
                               *)(local_638 + 8),(pair<int,_int> *)local_638._0_8_);
        local_460._0_4_ = pVar25.first;
        pmVar23 = std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&local_60,(key_type *)local_460);
        piVar6 = (pmVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar29 = (pmVar23->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start; piVar29 != piVar6; piVar29 = piVar29 + 1) {
          local_2c8._0_4_ = *piVar29;
          pvVar20 = (vector<int,std::allocator<int>> *)
                    std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](local_2d0,(key_type *)local_2c8);
          iVar3._M_current = *(int **)(pvVar20 + 8);
          if (iVar3._M_current == *(int **)(pvVar20 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar20,iVar3,(int *)local_460);
          }
          else {
            *iVar3._M_current = local_460._0_4_;
            *(int **)(pvVar20 + 8) = iVar3._M_current + 1;
          }
        }
        local_638._0_8_ = local_638._0_8_ + 8;
        boost::iterators::
        filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
        ::satisfy_predicate((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>
                             *)local_638);
      } while (local_638._0_8_ != local_4f8._0_8_);
    }
    if ((bool)local_4a8 == true) {
      boost::detail::shared_count::~shared_count(&local_490);
      _local_4a8 = _local_4a8 & 0xffffffffffffff00;
    }
    if ((bool)local_4d0.pi_._0_1_ == true) {
      boost::detail::shared_count::~shared_count((shared_count *)local_4b8);
      local_4d0.pi_ = local_4d0.pi_ & 0xffffffffffffff00;
    }
    if ((bool)local_4f8[8] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 0x10));
    }
    if ((bool)local_5f8[0x10] == true) {
      boost::detail::shared_count::~shared_count((shared_count *)(local_5e0 + 0x10));
      local_5f8._16_8_ = local_5f8._16_8_ & 0xffffffffffffff00;
    }
    if ((bool)local_610.pi_._0_1_ == true) {
      boost::detail::shared_count::~shared_count((shared_count *)local_5f8);
      local_610.pi_ = local_610.pi_ & 0xffffffffffffff00;
    }
    if (local_638[8] == '\x01') {
      boost::detail::shared_count::~shared_count(&local_618);
    }
    rVar19 = (reference)(local_2d0->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_2d8 = (reference)&(local_2d0->_M_t)._M_impl.super__Rb_tree_header;
    if (rVar19 != local_2d8) {
      do {
        local_638._0_4_ = *(undefined4 *)((long)rVar19 + 0x20);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_638 + 8),
                   (vector<int,_std::allocator<int>_> *)((long)rVar19 + 0x28));
        if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
        pcVar21 = mscomplex_t::index(msc->px,(char *)(local_638._0_8_ & 0xffffffff),__c_01);
        if ((int)pcVar21 != 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_460);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,"Failed to ensure condition ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,"msc->index(pr.first) == dim",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"at (",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                     ,0x69);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,"get_contrib_cps",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
          poVar26 = (ostream *)std::ostream::operator<<((ostream *)local_450,0x2a7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,") \n ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"Message : ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar26,"\"Computed the contribution of index != dim\"",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\n",1);
          prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar27,(string *)local_4f8);
          __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
        bVar17 = mscomplex_t::is_not_paired(msc->px,local_638._0_4_);
        uVar9 = auStack_628._0_8_;
        uVar7 = extraout_RDX;
        tVar8 = (type)local_638._8_8_;
        if (!bVar17) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_460);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,"Failed to ensure condition ",0x1b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,"msc->is_not_paired(pr.first)",0x1c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"at (",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                     ,0x69);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_450,"get_contrib_cps",0xf);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
          poVar26 = (ostream *)std::ostream::operator<<((ostream *)local_450,0x2a9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,") \n ",4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"Message : ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar26,"\"Computed the contribution to a cancelled cp\"",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\n",1);
          prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar27,(string *)local_4f8);
          __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        for (; tVar8 != (type)uVar9; tVar8 = (type)((long)tVar8 + 4)) {
          if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
          uVar18 = *(uint *)tVar8;
          pcVar21 = mscomplex_t::index(msc->px,(char *)(ulong)uVar18,(int)uVar7);
          if ((int)pcVar21 != 1) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_460);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"Failed to ensure condition ",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"msc->index(ccp) == dim",0x16);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"at (",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                       ,0x69);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"get_contrib_cps",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
            poVar26 = (ostream *)std::ostream::operator<<((ostream *)local_450,0x2ae);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,") \n ",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"Message : ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"\"other dim cp is attempting to contribute\"",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\n",1);
            prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar27,(string *)local_4f8);
            __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (msc->px == (mscomplex_t *)0x0) goto LAB_0016f690;
          bVar17 = mscomplex_t::is_paired(msc->px,uVar18);
          if (!bVar17) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_460);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"Failed to ensure condition ",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"msc->is_paired(ccp)",0x13);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"at (",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                       ,0x69);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"get_contrib_cps",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
            poVar26 = (ostream *)std::ostream::operator<<((ostream *)local_450,0x2b0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,") \n ",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"Message : ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"\"an unpaired cp is attempting to contribute\"",0x2c);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\n",1);
            prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar27,(string *)local_4f8);
            __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar4 = msc->px;
          if (pmVar4 == (mscomplex_t *)0x0) goto LAB_0016f690;
          uVar18 = mscomplex_t::pair_idx(pmVar4,uVar18);
          pcVar21 = mscomplex_t::index(pmVar4,(char *)(ulong)uVar18,__c_02);
          if ((int)pcVar21 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_460);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"Failed to ensure condition ",0x1b);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"msc->index(msc->pair_idx(ccp)) == odim",0x26);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,"at (",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                       ,0x69);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_450,"get_contrib_cps",0xf);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_450,",",1);
            poVar26 = (ostream *)std::ostream::operator<<((ostream *)local_450,0x2b2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,") \n ",4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"Message : ",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar26,"\"wrong cancellation type cp is attempting to contribute\"",0x38);
            std::__ostream_insert<char,std::char_traits<char>>(poVar26,"\n",1);
            prVar27 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar27,(string *)local_4f8);
            __cxa_throw(prVar27,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          uVar7 = extraout_RDX_00;
        }
        if ((type)local_638._8_8_ != (type)0x0) {
          operator_delete((void *)local_638._8_8_);
        }
        rVar19 = (reference)std::_Rb_tree_increment((_Rb_tree_node_base *)rVar19);
      } while (rVar19 != local_2d8);
    }
    local_200 = msc->px;
    if (local_200 != (element_type *)0x0) {
      local_640.
      super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin.super_type.m_iterator = (type)0;
      local_640.
      super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>,_boost::iterators::incrementable_traversal_tag>
      .m_End.super_type.m_iterator =
           SUB84((ulong)((long)(local_200->m_cp_cellid).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_200->m_cp_cellid).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2,0);
      local_1f8.pi_ = (msc->pn).pi_;
      if (local_1f8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1f8.pi_)->use_count_ = (local_1f8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::
      bind<bool,trimesh::mscomplex_t,int,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
                (&local_160,(boost *)mscomplex_t::is_not_paired,0,&local_200);
      boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
                ((filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                  *)local_230,
                 (forwarder<boost::range_detail::filter_holder> *)
                 &boost::adaptors::(anonymous_namespace)::filtered,&local_160);
      local_2c8._0_8_ = local_230._0_8_;
      local_2c8._8_8_ = local_230._8_8_;
      local_2b8.pi_ = (sp_counted_base *)local_220;
      sStack_2b0.pi_ = local_218.pi_;
      if (local_218.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_218.pi_)->use_count_ = (local_218.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::range_detail::
      filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
      ::filtered_range((filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                        *)local_4f8,
                       (bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
                        *)local_2c8,&local_640);
      boost::detail::shared_count::~shared_count(&sStack_2b0);
      local_210 = msc->px;
      local_208.pi_ = (msc->pn).pi_;
      if (local_208.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_208.pi_)->use_count_ = (local_208.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::
      bind<bool,trimesh::mscomplex_t,int,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
                (&local_180,(boost *)mscomplex_t::is_index_i_cp<1>,0,&local_210);
      boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
                ((filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
                  *)local_1d0,
                 (forwarder<boost::range_detail::filter_holder> *)
                 &boost::adaptors::(anonymous_namespace)::filtered,&local_180);
      local_2c8._0_8_ = CONCAT44(local_1d0._4_4_,local_1d0._0_4_);
      local_2c8._8_8_ = local_1d0._8_8_;
      local_2b8.pi_ = (sp_counted_base *)local_1c0;
      sStack_2b0.pi_ = local_1b8.pi_;
      if (local_1b8.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_1b8.pi_)->use_count_ = (local_1b8.pi_)->use_count_ + 1;
        UNLOCK();
      }
      boost::range_detail::
      filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
      ::filtered_range((filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                        *)local_638,
                       (bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
                        *)local_2c8,
                       (filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                        *)local_4f8);
      boost::detail::shared_count::~shared_count(&sStack_2b0);
      uVar9 = local_408._16_8_;
      uVar7 = local_430._8_8_;
      local_460._0_4_ = local_638._0_4_;
      local_460[8] = false;
      if (local_638[8] == '\x01') {
        local_450._0_8_ = auStack_628._0_8_;
        local_450._8_8_ = auStack_628._8_8_;
        local_450._16_8_ = local_618.pi_;
        local_438._M_current = (pair<int,_int> *)local_610.pi_;
        if (local_610.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          ((pair<int,_int> *)((long)local_610.pi_ + 8U))->first =
               ((pair<int,_int> *)((long)local_610.pi_ + 8U))->first + 1;
          UNLOCK();
        }
        local_460[8] = true;
      }
      local_430._0_4_ = local_608._0_4_;
      local_430._8_8_ = local_430._8_8_ & 0xffffffffffffff00;
      if (local_608[8] == '\x01') {
        local_420.pi_ = (sp_counted_base *)local_5f8._0_8_;
        sStack_418.pi_ = (sp_counted_base *)local_5f8._8_8_;
        local_410 = local_5f8._16_8_;
        local_408._0_8_ = local_5e0._0_8_;
        if ((type)local_5e0._0_8_ != (type)0x0) {
          LOCK();
          *(int *)(local_5e0._0_8_ + 8) = *(int *)(local_5e0._0_8_ + 8) + 1;
          UNLOCK();
        }
        local_430._9_7_ = SUB87(uVar7,1);
        local_430[8] = 1;
      }
      local_408._8_4_ = local_5e0._8_4_;
      local_408._16_8_ = local_408._16_8_ & 0xffffffffffffff00;
      if (local_5e0[0x10] == '\x01') {
        local_3f0._M_current = (pair<int,_int> *)local_5c8._0_8_;
        uStack_3e8 = local_5c8._8_8_;
        local_3e0._0_8_ = local_5c8._16_8_;
        local_3e0._8_8_ = local_5c8._24_8_;
        if ((sp_counted_base *)local_5c8._24_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(uint_least32_t *)(local_5c8._24_8_ + 8) = *(uint_least32_t *)(local_5c8._24_8_ + 8) + 1;
          UNLOCK();
        }
        local_408._17_7_ = SUB87(uVar9,1);
        local_408[0x10] = 1;
      }
      local_3d0.pi_._0_4_ = local_5a8.pi_._0_4_;
      local_3c8.super_type.m_iterator = (type)(type)local_5a0.m_iterator.super_type.m_iterator;
      local_3c0[0] = '\0';
      if ((bool)local_598._0_1_ == true) {
        local_3c0._8_8_ = auStack_590._0_8_;
        local_3c0._16_8_ = auStack_590._8_8_;
        local_3a8._M_current = (pair<int,_int> *)auStack_590._16_8_;
        local_3a0.pi_ = (sp_counted_base *)CONCAT71(local_578.pi_._1_7_,local_578.pi_._0_1_);
        if (local_3a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_3a0.pi_)->use_count_ = (local_3a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_3c0[0] = '\x01';
      }
      local_398._0_4_ = local_570._0_4_;
      local_398[8] = '\0';
      if (uStack_568._0_1_ == true) {
        local_398._16_8_ = local_560._0_8_;
        _Stack_380._M_current = (pair<int,_int> *)local_560._8_8_;
        local_378 = local_560._16_8_;
        local_370.pi_ = (sp_counted_base *)local_560._24_8_;
        if ((type)local_560._24_8_ != (type)0x0) {
          LOCK();
          *(int *)(local_560._24_8_ + 8) = *(int *)(local_560._24_8_ + 8) + 1;
          UNLOCK();
        }
        local_398[8] = '\x01';
      }
      local_368.super_type.m_iterator = (type)(type)local_540.m_iterator.super_type.m_iterator;
      local_360 = '\0';
      if (local_538 == true) {
        local_358 = (type)local_530._0_8_;
        uStack_350 = local_530._8_8_;
        local_348 = (type)local_530._16_8_;
        local_340.pi_ = (sp_counted_base *)local_530._24_8_;
        if ((sp_counted_base *)local_530._24_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(uint_least32_t *)(local_530._24_8_ + 8) = *(uint_least32_t *)(local_530._24_8_ + 8) + 1;
          UNLOCK();
        }
        local_360 = '\x01';
      }
      local_338.m_iterator = local_510.m_iterator;
      if ((local_538 & 1U) != 0) {
        boost::detail::shared_count::~shared_count((shared_count *)(local_530 + 0x18));
        local_538 = false;
      }
      if (uStack_568._0_1_ == true) {
        boost::detail::shared_count::~shared_count((shared_count *)(local_560 + 0x18));
        uStack_568 = uStack_568 & 0xffffffffffffff00;
      }
      if ((bool)local_598._0_1_ == true) {
        boost::detail::shared_count::~shared_count(&local_578);
        local_598 = (type)((ulong)local_598 & 0xffffffffffffff00);
      }
      if (local_5e0[0x10] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)(local_5c8 + 0x18));
        local_5e0._16_8_ = local_5e0._16_8_ & 0xffffffffffffff00;
      }
      if (local_608[8] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)local_5e0);
        local_608._8_8_ = local_608._8_8_ & 0xffffffffffffff00;
      }
      if (local_638[8] == '\x01') {
        boost::detail::shared_count::~shared_count(&local_610);
        local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
      }
      boost::detail::shared_count::~shared_count(&local_1b8);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&local_180.l_.
                         super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                         .
                         super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>
                         .a1_.t_ + 8));
      boost::detail::shared_count::~shared_count(&local_208);
      if (local_4b8[0] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)(local_4a0 + 8));
        local_4b8._0_8_ = local_4b8._0_8_ & 0xffffffffffffff00;
      }
      if ((bool)local_4f8[8] == true) {
        boost::detail::shared_count::~shared_count(&local_4d0);
        local_4f8[8] = false;
      }
      boost::detail::shared_count::~shared_count(&local_218);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&local_160.l_.
                         super_storage2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>
                         .
                         super_storage1<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>_>
                         .a1_.t_ + 8));
      boost::detail::shared_count::~shared_count(&local_1f8);
      sVar10.pi_ = local_490.pi_;
      uVar13 = local_4c8._8_8_;
      uVar11 = local_5e0._16_8_;
      uVar9 = local_608._8_8_;
      uVar7 = local_638._8_8_;
      local_638._0_4_ = local_460._0_4_;
      local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
      if ((bool)local_460[8] == true) {
        auStack_628._0_8_ = local_450._0_8_;
        auStack_628._8_8_ = local_450._8_8_;
        local_618.pi_ = (sp_counted_base *)local_450._16_8_;
        local_610.pi_ = (sp_counted_base *)local_438._M_current;
        if (local_438._M_current != (pair<int,_int> *)0x0) {
          LOCK();
          local_438._M_current[1].first = local_438._M_current[1].first + 1;
          UNLOCK();
        }
        local_638._9_7_ = SUB87(uVar7,1);
        local_638[8] = 1;
      }
      local_608._0_4_ = local_430._0_4_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffffffffff00;
      if (local_430[8] == '\x01') {
        local_5f8._0_8_ = local_420.pi_;
        local_5f8._8_8_ = sStack_418.pi_;
        local_5f8._16_8_ = local_410;
        local_5e0._0_8_ = local_408._0_8_;
        if ((type)local_408._0_8_ != (type)0x0) {
          LOCK();
          *(int *)(local_408._0_8_ + 8) = *(int *)(local_408._0_8_ + 8) + 1;
          UNLOCK();
        }
        local_608._9_7_ = SUB87(uVar9,1);
        local_608[8] = 1;
      }
      local_5e0._8_4_ = local_408._8_4_;
      local_5e0._16_8_ = local_5e0._16_8_ & 0xffffffffffffff00;
      if (local_408[0x10] == '\x01') {
        local_5c8._0_8_ = local_3f0._M_current;
        local_5c8._8_8_ = uStack_3e8;
        local_5c8._16_8_ = local_3e0._0_8_;
        local_5c8._24_8_ = local_3e0._8_8_;
        if ((sp_counted_base *)local_3e0._8_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(uint_least32_t *)(local_3e0._8_8_ + 8) = *(uint_least32_t *)(local_3e0._8_8_ + 8) + 1;
          UNLOCK();
        }
        local_5e0._17_7_ = SUB87(uVar11,1);
        local_5e0[0x10] = 1;
      }
      local_5a8.pi_._0_4_ = local_3d0.pi_._0_4_;
      local_4f8._0_4_ = local_460._0_4_;
      local_4f8[8] = false;
      if (local_638[8] == '\x01') {
        local_4e8._0_8_ = auStack_628._0_8_;
        local_4e8._8_8_ = auStack_628._8_8_;
        local_4e8._16_8_ = local_618.pi_;
        local_4d0.pi_ = local_610.pi_;
        if (local_610.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          ((pair<int,_int> *)((long)local_610.pi_ + 8U))->first =
               ((pair<int,_int> *)((long)local_610.pi_ + 8U))->first + 1;
          UNLOCK();
        }
        local_4f8[8] = true;
      }
      local_4c8._0_4_ = local_430._0_4_;
      local_4c8._8_8_ = local_4c8._8_8_ & 0xffffffffffffff00;
      if (local_608[8] == '\x01') {
        local_4b8._0_8_ = local_5f8._0_8_;
        local_4b8._8_8_ = local_5f8._8_8_;
        _local_4a8 = local_5f8._16_8_;
        local_4a0._0_8_ = local_5e0._0_8_;
        if ((type)local_5e0._0_8_ != (type)0x0) {
          LOCK();
          *(int *)(local_5e0._0_8_ + 8) = *(int *)(local_5e0._0_8_ + 8) + 1;
          UNLOCK();
        }
        local_4c8._9_7_ = SUB87(uVar13,1);
        local_4c8[8] = 1;
      }
      local_4a0._8_4_ = local_408._8_4_;
      local_490.pi_ = local_490.pi_ & 0xffffffffffffff00;
      if (local_5e0[0x10] == '\x01') {
        local_488._0_8_ = local_5c8._0_8_;
        local_488._8_8_ = local_5c8._8_8_;
        local_488._16_8_ = local_5c8._16_8_;
        local_488._24_8_ = local_5c8._24_8_;
        if ((sp_counted_base *)local_5c8._24_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(uint_least32_t *)(local_5c8._24_8_ + 8) = *(uint_least32_t *)(local_5c8._24_8_ + 8) + 1;
          UNLOCK();
        }
        local_490.pi_._1_7_ = SUB87(sVar10.pi_,1);
        local_490.pi_._0_1_ = 1;
      }
      local_468.super_type.m_iterator = (type)(type)local_3d0.pi_._0_4_;
      if (local_5e0[0x10] != '\0') {
        boost::detail::shared_count::~shared_count((shared_count *)(local_5c8 + 0x18));
        local_5e0._16_8_ = local_5e0._16_8_ & 0xffffffffffffff00;
      }
      if (local_608[8] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)local_5e0);
        local_608._8_8_ = local_608._8_8_ & 0xffffffffffffff00;
      }
      if (local_638[8] == '\x01') {
        boost::detail::shared_count::~shared_count(&local_610);
      }
      sVar10.pi_ = local_260.pi_;
      tVar8 = tStack_290;
      uVar13 = local_2c8._8_8_;
      uVar11 = local_5e0._16_8_;
      uVar9 = local_608._8_8_;
      uVar7 = local_638._8_8_;
      local_638._0_4_ = local_3c8.super_type.m_iterator;
      local_638._8_8_ = local_638._8_8_ & 0xffffffffffffff00;
      if (local_3c0[0] == '\x01') {
        auStack_628._0_8_ = local_3c0._8_8_;
        auStack_628._8_8_ = local_3c0._16_8_;
        local_618.pi_ = (sp_counted_base *)local_3a8._M_current;
        local_610.pi_ = local_3a0.pi_;
        if (local_3a0.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_3a0.pi_)->use_count_ = (local_3a0.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_638._9_7_ = SUB87(uVar7,1);
        local_638[8] = 1;
      }
      local_608._0_4_ = local_398._0_4_;
      local_608._8_8_ = local_608._8_8_ & 0xffffffffffffff00;
      if (local_398[8] == '\x01') {
        local_5f8._0_8_ = local_398._16_8_;
        local_5f8._8_8_ = _Stack_380._M_current;
        local_5f8._16_8_ = local_378;
        local_5e0._0_8_ = local_370.pi_;
        if ((type)local_370.pi_ != (type)0x0) {
          LOCK();
          (local_370.pi_)->use_count_ = (local_370.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_608._9_7_ = SUB87(uVar9,1);
        local_608[8] = 1;
      }
      local_5e0._8_4_ = local_368.super_type.m_iterator;
      local_5e0._16_8_ = local_5e0._16_8_ & 0xffffffffffffff00;
      if (local_360 == '\x01') {
        local_5c8._0_8_ = local_358;
        local_5c8._8_8_ = uStack_350;
        local_5c8._16_8_ = local_348;
        local_5c8._24_8_ = local_340.pi_;
        if (local_340.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_340.pi_)->use_count_ = (local_340.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_5e0._17_7_ = SUB87(uVar11,1);
        local_5e0[0x10] = 1;
      }
      local_5a8.pi_._0_4_ = local_338.m_iterator;
      local_2c8._0_4_ = local_3c8.super_type.m_iterator;
      local_2c8._8_8_ = local_2c8._8_8_ & 0xffffffffffffff00;
      if (local_638[8] == '\x01') {
        local_2b8.pi_ = (sp_counted_base *)auStack_628._0_8_;
        sStack_2b0.pi_ = (sp_counted_base *)auStack_628._8_8_;
        local_2a8.pi_ = local_618.pi_;
        local_2a0.pi_ = local_610.pi_;
        if (local_610.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          ((pair<int,_int> *)((long)local_610.pi_ + 8U))->first =
               ((pair<int,_int> *)((long)local_610.pi_ + 8U))->first + 1;
          UNLOCK();
        }
        local_2c8._9_7_ = SUB87(uVar13,1);
        local_2c8[8] = 1;
      }
      local_298._0_4_ = local_398._0_4_;
      tStack_290 = (type)((ulong)tStack_290 & 0xffffffffffffff00);
      if (local_608[8] == '\x01') {
        local_288.pi_ = (sp_counted_base *)local_5f8._0_8_;
        ppStack_280 = (pair<int,_int> *)local_5f8._8_8_;
        local_278 = local_5f8._16_8_;
        local_270.pi_ = (sp_counted_base *)local_5e0._0_8_;
        if ((type)local_5e0._0_8_ != (type)0x0) {
          LOCK();
          *(int *)(local_5e0._0_8_ + 8) = *(int *)(local_5e0._0_8_ + 8) + 1;
          UNLOCK();
        }
        tStack_290._1_7_ = tVar8._1_7_;
        tStack_290._0_1_ = 1;
      }
      uStack_268 = CONCAT44(uStack_268._4_4_,local_368.super_type.m_iterator);
      local_260.pi_ = local_260.pi_ & 0xffffffffffffff00;
      if (local_5e0[0x10] == '\x01') {
        local_258 = (type)local_5c8._0_8_;
        uStack_250 = local_5c8._8_8_;
        local_248 = (type)local_5c8._16_8_;
        local_240.pi_ = (sp_counted_base *)local_5c8._24_8_;
        if ((sp_counted_base *)local_5c8._24_8_ != (sp_counted_base *)0x0) {
          LOCK();
          *(uint_least32_t *)(local_5c8._24_8_ + 8) = *(uint_least32_t *)(local_5c8._24_8_ + 8) + 1;
          UNLOCK();
        }
        local_260.pi_._1_7_ = SUB87(sVar10.pi_,1);
        local_260.pi_._0_1_ = 1;
      }
      local_238 = local_338.m_iterator;
      if (local_5e0[0x10] != '\0') {
        boost::detail::shared_count::~shared_count((shared_count *)(local_5c8 + 0x18));
        local_5e0._16_8_ = local_5e0._16_8_ & 0xffffffffffffff00;
      }
      if (local_608[8] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)local_5e0);
        local_608._8_8_ = local_608._8_8_ & 0xffffffffffffff00;
      }
      if (local_638[8] == '\x01') {
        boost::detail::shared_count::~shared_count(&local_610);
      }
      if (local_4f8._0_4_ != local_2c8._0_4_) {
        do {
          local_638._0_4_ = local_4f8._0_4_;
          pvVar20 = (vector<int,std::allocator<int>> *)
                    std::
                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ::operator[](local_2d0,(key_type *)local_638);
          iVar3._M_current = *(int **)(pvVar20 + 8);
          if (iVar3._M_current == *(int **)(pvVar20 + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (pvVar20,iVar3,(int *)local_638);
          }
          else {
            *iVar3._M_current = local_638._0_4_;
            *(int **)(pvVar20 + 8) = iVar3._M_current + 1;
          }
          local_4f8._0_4_ = local_4f8._0_4_ + 1;
          boost::iterators::
          filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>
          ::satisfy_predicate((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>
                               *)local_4f8);
          boost::iterators::
          filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
          ::satisfy_predicate((filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                               *)local_4f8);
        } while (local_4f8._0_4_ != local_2c8._0_4_);
      }
      if ((char)local_260.pi_ == '\x01') {
        boost::detail::shared_count::~shared_count(&local_240);
        local_260.pi_ = local_260.pi_ & 0xffffffffffffff00;
      }
      if (tStack_290._0_1_ == '\x01') {
        boost::detail::shared_count::~shared_count(&local_270);
        tStack_290 = (type)((ulong)tStack_290 & 0xffffffffffffff00);
      }
      if (local_2c8[8] == '\x01') {
        boost::detail::shared_count::~shared_count(&local_2a0);
      }
      if (local_490.pi_._0_1_ == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)(local_488 + 0x18));
        local_490.pi_ = local_490.pi_ & 0xffffffffffffff00;
      }
      if (local_4c8[8] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)local_4a0);
        local_4c8._8_8_ = local_4c8._8_8_ & 0xffffffffffffff00;
      }
      if ((bool)local_4f8[8] == true) {
        boost::detail::shared_count::~shared_count(&local_4d0);
      }
      if (local_360 == '\x01') {
        boost::detail::shared_count::~shared_count(&local_340);
        local_360 = '\0';
      }
      if (local_398[8] == '\x01') {
        boost::detail::shared_count::~shared_count(&local_370);
        local_398[8] = '\0';
      }
      if (local_3c0[0] == '\x01') {
        boost::detail::shared_count::~shared_count(&local_3a0);
        local_3c0[0] = '\0';
      }
      if (local_408[0x10] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)(local_3e0 + 8));
        local_408._16_8_ = local_408._16_8_ & 0xffffffffffffff00;
      }
      if (local_430[8] == '\x01') {
        boost::detail::shared_count::~shared_count((shared_count *)local_408);
        local_430._8_8_ = local_430._8_8_ & 0xffffffffffffff00;
      }
      if ((bool)local_460[8] == true) {
        boost::detail::shared_count::~shared_count((shared_count *)&local_438);
      }
      if (local_80 == true) {
        boost::detail::shared_count::~shared_count(&local_68);
        local_80 = false;
      }
      if (local_a8 == true) {
        boost::detail::shared_count::~shared_count(local_90);
        local_a8 = false;
      }
      if (local_c8 == true) {
        boost::detail::shared_count::~shared_count(&local_b0);
        local_c8 = false;
      }
      if (local_f0 == true) {
        boost::detail::shared_count::~shared_count(local_d8);
        local_f0 = false;
      }
      if (local_118 == true) {
        boost::detail::shared_count::~shared_count(local_100);
        local_118 = false;
      }
      if ((bool)local_140[8] == true) {
        boost::detail::shared_count::~shared_count((shared_count *)(local_140 + 0x20));
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
  }
LAB_0016f690:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<trimesh::mscomplex_t>::operator->() const [T = trimesh::mscomplex_t]"
               );
}

Assistant:

void get_contrib_cps(mscomplex_ptr_t msc,contrib_t& contrib)
{
  const eGDIR odir = (dir == ASC)?(DES):(ASC);
  const int   odim = (dir == ASC)?(dim +1):(dim -1);

  contrib_t contrib_map;

  // first, obtain a sequence of cancellations so that
  // a) each pair is ordered by dir ..
  //    i.e if dir is DES then look at a (2,1) as (2,1) and not (1,2)
  // b) pairs that have not yet been cancelled are removed
  // c) pairs whose first element have index == dim

  BOOST_AUTO(canc_rng,msc->m_canc_list
             |badpt::sliced(0,msc->m_multires_version)
             |badpt::transformed(bind(order_by_dir_index<dir>,msc,_1))
             |badpt::filtered(bind(is_dim_pair<dim,odim>,msc,_1))
             );

  // This part computes for each cancelled critical point,
  // the surviving critical points to which it contributes its
  // finest resolution geometry .
  BOOST_FOREACH(int_pair_t pr,canc_rng|badpt::reversed)
  {
    int p = pr.first,q = pr.second;

    int_list_t & pcontrib = contrib_map[p];

    // for each qa in the asc conn of q:
    BOOST_FOREACH(int qa, msc->m_conn[odir][q])
    {
      // a) if qa is not paired ..
      if(msc->is_not_paired(qa))
      {
        // .. p contributes to qa.
        pcontrib.push_back(qa);
      }
      // b) if qa is paired and qa's pair and q have same index ..
      else if(msc->index(q) == msc->index(msc->pair_idx(qa)))
      {
        // .. then foreach qaqa that qa contributes to  ..
        BOOST_FOREACH(int qaqa,contrib_map[qa])
        {
          // .. p contributes to qaqa.
          pcontrib.push_back(qaqa);

          // pdpd has to be a surviving cp
          ASSERT(msc->is_not_paired(qaqa));
        }
      }
    }
  }

  // This part just reverses info computed earlier.
  // i.e each surviving critical point will have a
  // list of cancelled critical points that contribute
  // their finest res geometry to it.

  BOOST_FOREACH(int_pair_t pr, canc_rng)
  {
    int p = pr.first;

    BOOST_FOREACH(int p_, contrib_map[p])
    {
      contrib[p_].push_back(p);
    }
  }

  // Sanity checks.
  BOOST_FOREACH(contrib_t::value_type pr, contrib)
  {
    ENSURE(msc->index(pr.first) == dim,
           "Computed the contribution of index != dim");
    ENSURE(msc->is_not_paired(pr.first),
           "Computed the contribution to a cancelled cp");

    BOOST_FOREACH(int ccp, pr.second)
    {
      ENSURE(msc->index(ccp) == dim,
             "other dim cp is attempting to contribute");
      ENSURE(msc->is_paired(ccp),
             "an unpaired cp is attempting to contribute");
      ENSURE(msc->index(msc->pair_idx(ccp)) == odim,
             "wrong cancellation type cp is attempting to contribute");
    }
  }

  // finally add each cp to its own list of contributors
  BOOST_FOREACH(int cp, msc->cp_range()
                |badpt::filtered(bind(&mscomplex_t::is_not_paired,msc,_1))
                |badpt::filtered(bind(&mscomplex_t::is_index_i_cp<dim>,msc,_1)))
  {
    contrib[cp].push_back(cp);
  }
}